

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow *window)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiContext *g;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImRect IVar7;
  
  IVar1 = (GImGui->Style).DisplaySafeAreaPadding;
  IVar2 = (GImGui->IO).DisplaySize;
  fVar3 = IVar1.x;
  fVar4 = IVar1.y;
  fVar5 = IVar2.x;
  fVar6 = IVar2.y;
  fVar3 = (float)((uint)-fVar3 & -(uint)(fVar3 + fVar3 < fVar5));
  fVar4 = (float)((uint)-fVar4 & -(uint)(fVar4 + fVar4 < fVar6));
  IVar7.Min.x = 0.0 - fVar3;
  IVar7.Min.y = 0.0 - fVar4;
  IVar7.Max.x = fVar3 + fVar5;
  IVar7.Max.y = fVar4 + fVar6;
  return IVar7;
}

Assistant:

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow* window)
{
    IM_UNUSED(window);
    ImVec2 padding = GImGui->Style.DisplaySafeAreaPadding;
    ImRect r_screen = GetViewportRect();
    r_screen.Expand(ImVec2((r_screen.GetWidth() > padding.x * 2) ? -padding.x : 0.0f, (r_screen.GetHeight() > padding.y * 2) ? -padding.y : 0.0f));
    return r_screen;
}